

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O0

void __thiscall Alice::ObliviousTranslate(Alice *this)

{
  long lVar1;
  Message MVar2;
  undefined1 auStack_e8 [8];
  Message msg_from_Bob;
  Message msg_for_Bob;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_b0;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_98;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_80;
  undefined1 local_68 [8];
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> Perm_D;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_40;
  undefined1 local_28 [8];
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> Perm_P;
  Alice *this_local;
  
  Perm_P.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(&local_40,&(this->super_Party).P);
  ExtractPermutationShare
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_28,this
             ,&local_40,(this->super_Party).n_p,5);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector(&local_40);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(&local_80,&(this->super_Party).D);
  ExtractPermutationShare
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_68,this
             ,&local_80,(this->super_Party).n_d,2);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector(&local_80);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            (&local_98,
             (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_28);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            (&local_b0,
             (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_68);
  ObliviousTranslate(this,&local_98,&local_b0);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector(&local_b0);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector(&local_98);
  lVar1 = (this->super_Party).pc;
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             &msg_for_Bob.scalar2,
             (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_28);
  lVar1 = ObliviousTranslateSingleAddress
                    (this,lVar1,
                     (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                     &msg_for_Bob.scalar2);
  (this->super_Party).pc = lVar1;
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             &msg_for_Bob.scalar2);
  Message::Message((Message *)&msg_from_Bob.scalar2);
  Message::Message((Message *)auStack_e8);
  msg_from_Bob.scalar2 = (this->super_Party).pc;
  Server::Send(this->srv,(Message *)&msg_from_Bob.scalar2);
  MVar2 = Server::Receive(this->srv);
  msg_from_Bob.scalar1 = MVar2.scalar2;
  auStack_e8 = (undefined1  [8])MVar2.scalar1;
  (this->super_Party).pc = (this->super_Party).pc + (long)auStack_e8;
  UpdateAlphas(this);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_68);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_28);
  return;
}

Assistant:

void Alice::ObliviousTranslate()
{
    std::vector<std::pair<long,long>> Perm_P = ExtractPermutationShare(P, n_p, 5);
    std::vector<std::pair<long,long>> Perm_D = ExtractPermutationShare(D, n_d, 2);
    ObliviousTranslate(Perm_P, Perm_D);
    pc = ObliviousTranslateSingleAddress(pc, Perm_P);
    Message msg_for_Bob, msg_from_Bob;
    msg_for_Bob.scalar1 = pc;
    srv->Send(msg_for_Bob);
    msg_from_Bob = srv->Receive();
    pc = pc + msg_from_Bob.scalar1;
    UpdateAlphas();  
}